

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O3

void __thiscall
Diligent::VariableSizeAllocationsManager::DbgVerifyList(VariableSizeAllocationsManager *this)

{
  _Rb_tree_header *p_Var1;
  OffsetType *Args;
  TFreeBlocksBySizeMap *pTVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  char (*Args_1) [74];
  OffsetType OVar7;
  OffsetType *in_R8;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *Args_00;
  string msg;
  _Alloc_hider in_stack_ffffffffffffffa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  VariableSizeAllocationsManager *local_38;
  
  p_Var6 = (_Base_ptr)(this->m_CurrAlignment - 1);
  if ((_Base_ptr)(this->m_CurrAlignment ^ (ulong)p_Var6) <= p_Var6) {
    FormatString<char[26],char[30]>
              ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(m_CurrAlignment)",(char (*) [30])p_Var6);
    p_Var6 = (_Base_ptr)0x1c3;
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1c3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  p_Var4 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    FormatString<char[26],char[57]>
              ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
               (char (*) [57])p_Var6);
    p_Var6 = (_Base_ptr)0x1c6;
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1c6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  p_Var1 = &(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header;
  local_38 = this;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    OVar7 = 0;
  }
  else {
    Args = &this->m_CurrAlignment;
    OVar7 = 0;
    p_Var5 = &p_Var1->_M_header;
    do {
      p_Var8 = p_Var4;
      Args_00 = p_Var8 + 1;
      uVar3 = *(ulong *)(p_Var8 + 1);
      Args_1 = (char (*) [74])((long)&(p_Var8[1]._M_parent)->_M_color + uVar3);
      if ((char (*) [74])local_38->m_MaxSize < Args_1) {
        FormatString<char[26],char[74]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "BlockIt->first >= 0 && BlockIt->first + BlockIt->second.Size <= m_MaxSize",
                   Args_1);
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1c9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
        uVar3 = *(ulong *)Args_00;
      }
      if ((*Args - 1 & uVar3) != 0) {
        in_R8 = Args;
        FormatString<char[15],unsigned_long,char[10],unsigned_long,char[9]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Block offset (",
                   (char (*) [15])Args_00,(unsigned_long *)") is not ",(char (*) [10])Args,
                   (unsigned_long *)0x6b5d50,(char (*) [9])in_stack_ffffffffffffffa8._M_p);
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1ca);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
        uVar3 = *(ulong *)Args_00;
      }
      p_Var6 = p_Var8[1]._M_parent;
      if (((char *)((long)&p_Var6->_M_color + uVar3) < (char *)local_38->m_MaxSize) &&
         ((*Args - 1 & (ulong)p_Var6) != 0)) {
        FormatString<char[49],unsigned_long,char[9]>
                  ((string *)&stack0xffffffffffffffa8,
                   (Diligent *)"All block sizes except for the last one must be ",
                   (char (*) [49])Args,(unsigned_long *)0x6b5d50,(char (*) [9])in_R8);
        p_Var6 = (_Base_ptr)0x1cc;
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1cc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      p_Var4 = p_Var8[1]._M_left;
      if (p_Var8 != p_Var4[1]._M_parent) {
        FormatString<char[26],char[49]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BlockIt == BlockIt->second.OrderBySizeIt->second",
                   (char (*) [49])p_Var6);
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1cd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
        p_Var4 = p_Var8[1]._M_left;
      }
      p_Var6 = p_Var8[1]._M_parent;
      if (p_Var6 != *(_Base_ptr *)(p_Var4 + 1)) {
        FormatString<char[26],char[61]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BlockIt->second.Size == BlockIt->second.OrderBySizeIt->first",
                   (char (*) [61])p_Var6);
        p_Var6 = (_Base_ptr)0x1ce;
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1ce);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (*(ulong *)Args_00 <= (long)&(p_Var5[1]._M_parent)->_M_color + *(size_t *)(p_Var5 + 1))) {
        FormatString<char[49]>
                  ((string *)&stack0xffffffffffffffa8,
                   (char (*) [49])"Unmerged adjacent or overlapping blocks detected");
        p_Var6 = (_Base_ptr)0x1d3;
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1d3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      OVar7 = (long)&(p_Var8[1]._M_parent)->_M_color + OVar7;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      p_Var5 = p_Var8;
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  pTVar2 = &local_38->m_FreeBlocksBySize;
  for (p_Var5 = (local_38->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    p_Var6 = p_Var5[1]._M_parent;
    if (*(_Base_ptr *)(p_Var5 + 1) != p_Var6[1]._M_parent) {
      FormatString<char[26],char[47]>
                ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"OrderIt->first == OrderIt->second->second.Size",
                 (char (*) [47])p_Var6);
      p_Var6 = (_Base_ptr)0x1dd;
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1dd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
  }
  if (OVar7 != local_38->m_FreeSize) {
    FormatString<char[26],char[28]>
              ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TotalFreeSize == m_FreeSize",(char (*) [28])p_Var6);
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1e1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DbgVerifyList()
    {
        OffsetType TotalFreeSize = 0;

        VERIFY_EXPR(IsPowerOfTwo(m_CurrAlignment));
        auto BlockIt     = m_FreeBlocksByOffset.begin();
        auto PrevBlockIt = m_FreeBlocksByOffset.end();
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        while (BlockIt != m_FreeBlocksByOffset.end())
        {
            VERIFY_EXPR(BlockIt->first >= 0 && BlockIt->first + BlockIt->second.Size <= m_MaxSize);
            VERIFY((BlockIt->first & (m_CurrAlignment - 1)) == 0, "Block offset (", BlockIt->first, ") is not ", m_CurrAlignment, "-aligned");
            if (BlockIt->first + BlockIt->second.Size < m_MaxSize)
                VERIFY((BlockIt->second.Size & (m_CurrAlignment - 1)) == 0, "All block sizes except for the last one must be ", m_CurrAlignment, "-aligned");
            VERIFY_EXPR(BlockIt == BlockIt->second.OrderBySizeIt->second);
            VERIFY_EXPR(BlockIt->second.Size == BlockIt->second.OrderBySizeIt->first);
            //   PrevBlock.Offset                   BlockIt.first
            //     |                                  |
            // ~ ~ |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~
            //
            VERIFY(PrevBlockIt == m_FreeBlocksByOffset.end() || BlockIt->first > PrevBlockIt->first + PrevBlockIt->second.Size, "Unmerged adjacent or overlapping blocks detected");
            TotalFreeSize += BlockIt->second.Size;

            PrevBlockIt = BlockIt;
            ++BlockIt;
        }

        auto OrderIt = m_FreeBlocksBySize.begin();
        while (OrderIt != m_FreeBlocksBySize.end())
        {
            VERIFY_EXPR(OrderIt->first == OrderIt->second->second.Size);
            ++OrderIt;
        }

        VERIFY_EXPR(TotalFreeSize == m_FreeSize);
    }